

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O1

bool __thiscall cmMessenger::IsMessageTypeVisible(cmMessenger *this,MessageType t)

{
  byte bVar1;
  
  bVar1 = true;
  switch(t) {
  case AUTHOR_WARNING:
    bVar1 = this->SuppressDevWarnings;
    break;
  case AUTHOR_ERROR:
    return this->DevWarningsAsErrors;
  default:
    goto switchD_0023d8bf_caseD_2;
  case DEPRECATION_ERROR:
    return this->DeprecatedWarningsAsErrors;
  case DEPRECATION_WARNING:
    bVar1 = this->SuppressDeprecatedWarnings;
  }
  bVar1 = bVar1 ^ 1;
switchD_0023d8bf_caseD_2:
  return (bool)bVar1;
}

Assistant:

bool cmMessenger::IsMessageTypeVisible(MessageType t) const
{
  bool isVisible = true;

  if (t == MessageType::DEPRECATION_ERROR) {
    if (!this->GetDeprecatedWarningsAsErrors()) {
      isVisible = false;
    }
  } else if (t == MessageType::DEPRECATION_WARNING) {
    if (this->GetSuppressDeprecatedWarnings()) {
      isVisible = false;
    }
  } else if (t == MessageType::AUTHOR_ERROR) {
    if (!this->GetDevWarningsAsErrors()) {
      isVisible = false;
    }
  } else if (t == MessageType::AUTHOR_WARNING) {
    if (this->GetSuppressDevWarnings()) {
      isVisible = false;
    }
  }

  return isVisible;
}